

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

unsigned_long __thiscall rlist::listLength(rlist *this)

{
  listNode *plVar1;
  unsigned_long uVar2;
  
  this->length = 0;
  plVar1 = this->rl->head;
  if (plVar1 != (listNode *)0x0) {
    uVar2 = this->length;
    do {
      uVar2 = uVar2 + 1;
      plVar1 = plVar1->next;
    } while (plVar1 != (listNode *)0x0);
    this->view = (listNode *)0x0;
    this->length = uVar2;
  }
  uVar2 = this->length;
  this->rl->len = uVar2;
  return uVar2;
}

Assistant:

unsigned long rlist::listLength(){
    length=0;
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=nullptr){
            length++;
            view=view->next;
        }
    } 
    return rl->len=length;
}